

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

string * __thiscall
deqp::gls::BuiltinPrecisionTests::intervalToString<tcu::Matrix<float,4,2>>
          (string *__return_storage_ptr__,BuiltinPrecisionTests *this,FloatFormat *fmt,IVal *ival)

{
  ostringstream oss;
  undefined1 local_250 [376];
  Matrix<tcu::Interval,_4,_2> local_d8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_250);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix(&local_d8,(Matrix<tcu::Interval,_4,_2> *)fmt);
  ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doPrintIVal
            ((FloatFormat *)this,&local_d8,(ostream *)local_250);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_250);
  std::ios_base::~ios_base((ios_base *)(local_250 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}